

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_short,unsigned_short>
          (Thread *this,BinopFunc<unsigned_short,_unsigned_short> *f)

{
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  unsigned_short uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  byte local_3d;
  undefined1 auStack_3c [7];
  u8 i;
  SR result;
  Simd<unsigned_short,_(unsigned_char)__b_> lhs;
  uint amount;
  BinopFunc<unsigned_short,_unsigned_short> *f_local;
  Thread *this_local;
  
  uVar2 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  for (local_3d = 0; local_3d < 8; local_3d = local_3d + 1) {
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)(result.v + 4),local_3d);
    uVar1 = (*f)(*puVar3,(unsigned_short)uVar2);
    puVar3 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_3c,local_3d);
    *puVar3 = uVar1;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = auStack_3c._0_2_;
  value.v[1] = auStack_3c._2_2_;
  value.v[2] = auStack_3c._4_2_;
  value.v[3] = stack0xffffffffffffffca;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}